

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl.cpp
# Opt level: O2

int LiveGLSLRender(LiveGLSL *live_glsl)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  pointer pGVar6;
  undefined4 uVar8;
  pointer pTVar7;
  undefined4 uVar9;
  HGUI handle;
  double dVar10;
  bool bVar11;
  uint32_t *puVar12;
  PFNGLGETUNIFORMLOCATIONPROC p_Var13;
  PFNGLUNIFORM1FPROC p_Var14;
  PFNGLUNIFORM1IPROC p_Var15;
  PFNGLUNIFORM2FPROC p_Var16;
  PFNGLUNIFORM3FPROC p_Var17;
  __type _Var18;
  int iVar19;
  GLint GVar20;
  GLuint GVar21;
  void *data;
  uint32_t *puVar22;
  GUIComponent *gui_component;
  ulong uVar23;
  pointer pRVar24;
  pointer pGVar25;
  pointer pTVar26;
  pointer pRVar27;
  RenderPass *render_pass;
  pointer pRVar28;
  RenderPass *render_pass_2;
  ulong uVar29;
  GLsizei y_00;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *__range3;
  int local_fc;
  GLfloat local_ec;
  double y;
  double x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string *local_b8;
  uint32_t *local_b0;
  uint32_t *local_a8;
  pointer local_a0;
  pointer local_98;
  ulong local_90;
  vector<GUITexture,_std::allocator<GUITexture>_> textures;
  _Vector_base<GUITexture,_std::allocator<GUITexture>_> local_68;
  string local_50;
  
  glfwGetTime();
  local_b8 = (string *)&live_glsl->ShaderPath;
  local_a8 = (uint32_t *)&live_glsl->WindowWidth;
  local_b0 = (uint32_t *)&live_glsl->WindowHeight;
  do {
    iVar19 = glfwWindowShouldClose(live_glsl->GLFWWindowHandle);
    if (iVar19 != 0) {
      return 0;
    }
    std::__cxx11::string::string((string *)&local_50,local_b8);
    ReloadShaderIfChanged(live_glsl,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    glfwGetCursorPos(live_glsl->GLFWWindowHandle,&x,&y);
    x = x * (double)live_glsl->PixelDensity;
    y = (double)live_glsl->PixelDensity * y;
    iVar19 = glfwGetMouseButton(live_glsl->GLFWWindowHandle,0);
    if (live_glsl->ShaderCompiled == true) {
      pGVar6 = (live_glsl->GUIComponents).
               super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pGVar25 = (live_glsl->GUIComponents).
                     super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
                     super__Vector_impl_data._M_start; pGVar25 != pGVar6; pGVar25 = pGVar25 + 1) {
        pGVar25->IsInUse = false;
        pRVar24 = (live_glsl->RenderPasses).
                  super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pRVar27 = (live_glsl->RenderPasses).
                       super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                       super__Vector_impl_data._M_start; pRVar27 != pRVar24; pRVar27 = pRVar27 + 1)
        {
          GVar20 = (*glad_glGetUniformLocation)
                             ((pRVar27->Program).Handle,(pGVar25->UniformName)._M_dataplus._M_p);
          pGVar25->IsInUse = (bool)(pGVar25->IsInUse | GVar20 != -1);
        }
      }
    }
    textures.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    textures.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    textures.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pRVar24 = (live_glsl->RenderPasses).super__Vector_base<RenderPass,_std::allocator<RenderPass>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (pRVar27 = (live_glsl->RenderPasses).
                   super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                   super__Vector_impl_data._M_start; pRVar27 != pRVar24; pRVar27 = pRVar27 + 1) {
      if (pRVar27->TextureId != 0) {
        uVar4 = pRVar27->Width;
        uVar8 = pRVar27->Height;
        local_d8._M_dataplus._M_p._0_4_ = pRVar27->TextureId;
        local_d8._M_dataplus._M_p._4_4_ = uVar4;
        local_d8._M_string_length._0_4_ = uVar8;
        std::vector<GUITexture,_std::allocator<GUITexture>_>::push_back
                  (&textures,(value_type *)&local_d8);
      }
      pTVar7 = (pRVar27->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pTVar26 = (pRVar27->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
                     _M_impl.super__Vector_impl_data._M_start; pTVar26 != pTVar7;
          pTVar26 = pTVar26 + 1) {
        uVar5 = pTVar26->Width;
        uVar9 = pTVar26->Height;
        local_d8._M_dataplus._M_p._0_4_ = pTVar26->Id;
        local_d8._M_dataplus._M_p._4_4_ = uVar5;
        local_d8._M_string_length._0_4_ = uVar9;
        std::vector<GUITexture,_std::allocator<GUITexture>_>::push_back
                  (&textures,(value_type *)&local_d8);
      }
    }
    handle = live_glsl->GUI;
    std::vector<GUITexture,_std::allocator<GUITexture>_>::vector
              ((vector<GUITexture,_std::allocator<GUITexture>_> *)&local_68,&textures);
    GUINewFrame(handle,&live_glsl->GUIComponents,
                (vector<GUITexture,_std::allocator<GUITexture>_> *)&local_68);
    std::_Vector_base<GUITexture,_std::allocator<GUITexture>_>::~_Vector_base(&local_68);
    if (live_glsl->ShaderCompiled == true) {
      local_ec = 1.0;
      if (iVar19 != 1) {
        local_ec = 0.0;
      }
      local_a0 = (live_glsl->RenderPasses).
                 super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      for (pRVar27 = (live_glsl->RenderPasses).
                     super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                     super__Vector_impl_data._M_start; pRVar27 != local_a0; pRVar27 = pRVar27 + 1) {
        puVar22 = &pRVar27->Height;
        puVar12 = &pRVar27->Width;
        if (pRVar27->IsMain != false) {
          puVar22 = local_b0;
          puVar12 = local_a8;
        }
        uVar2 = *puVar12;
        uVar3 = *puVar22;
        fVar1 = live_glsl->PixelDensity;
        (*glad_glBindFramebuffer)(0x8d40,pRVar27->FBO);
        (*glad_glClear)(0x4000);
        GVar21 = (pRVar27->Program).Handle;
        if (GVar21 == 0) {
          __assert_fail("render_pass.Program.Handle != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/liveglsl.cpp"
                        ,0xfb,"int LiveGLSLRender(LiveGLSL *)");
        }
        (*glad_glUseProgram)(GVar21);
        (*glad_glBindBuffer)(0x8892,live_glsl->VertexBufferId);
        uVar23 = (ulong)((float)uVar2 * fVar1);
        uVar29 = (ulong)((float)uVar3 * fVar1);
        (*glad_glViewport)(0,0,(GLsizei)uVar23,(GLsizei)uVar29);
        p_Var16 = glad_glUniform2f;
        GVar20 = (*glad_glGetUniformLocation)((pRVar27->Program).Handle,"resolution");
        (*p_Var16)(GVar20,(float)(uVar23 & 0xffffffff),(float)(uVar29 & 0xffffffff));
        p_Var14 = glad_glUniform1f;
        GVar20 = (*glad_glGetUniformLocation)((pRVar27->Program).Handle,"time");
        dVar10 = glfwGetTime();
        (*p_Var14)(GVar20,(float)dVar10);
        p_Var14 = glad_glUniform1f;
        GVar20 = (*glad_glGetUniformLocation)((pRVar27->Program).Handle,"pixel_ratio");
        (*p_Var14)(GVar20,live_glsl->PixelDensity);
        p_Var17 = glad_glUniform3f;
        GVar20 = (*glad_glGetUniformLocation)((pRVar27->Program).Handle,"mouse");
        (*p_Var17)(GVar20,(float)x,(float)y,local_ec);
        if ((pRVar27->Input)._M_string_length == 0) {
          uVar23 = 0;
        }
        else {
          pRVar28 = (live_glsl->RenderPasses).
                    super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          uVar23 = 0;
          local_98 = pRVar28;
          for (pRVar24 = (live_glsl->RenderPasses).
                         super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                         super__Vector_impl_data._M_start; pRVar24 != pRVar28; pRVar24 = pRVar24 + 1
              ) {
            _Var18 = std::operator==(&pRVar24->Output,&pRVar27->Input);
            if (_Var18) {
              (*glad_glActiveTexture)((int)uVar23 + 0x84c0);
              (*glad_glBindTexture)(0xde1,pRVar24->TextureId);
              p_Var15 = glad_glUniform1i;
              GVar20 = (*glad_glGetUniformLocation)
                                 ((pRVar27->Program).Handle,(pRVar27->Input)._M_dataplus._M_p);
              (*p_Var15)(GVar20,(int)uVar23);
              p_Var16 = glad_glUniform2f;
              p_Var13 = glad_glGetUniformLocation;
              GVar21 = (pRVar27->Program).Handle;
              local_90 = uVar23;
              std::operator+(&local_d8,&pRVar27->Input,"_resolution");
              GVar20 = (*p_Var13)(GVar21,(GLchar *)
                                         CONCAT44(local_d8._M_dataplus._M_p._4_4_,
                                                  (GLuint)local_d8._M_dataplus._M_p));
              (*p_Var16)(GVar20,(float)pRVar24->Width,(float)pRVar24->Height);
              std::__cxx11::string::~string((string *)&local_d8);
              uVar23 = (ulong)((int)local_90 + 1);
              pRVar28 = local_98;
            }
          }
        }
        pGVar6 = (live_glsl->GUIComponents).
                 super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pGVar25 = (live_glsl->GUIComponents).
                       super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
                       super__Vector_impl_data._M_start; pGVar25 != pGVar6; pGVar25 = pGVar25 + 1) {
          GVar20 = (*glad_glGetUniformLocation)
                             ((pRVar27->Program).Handle,(pGVar25->UniformName)._M_dataplus._M_p);
          switch(pGVar25->UniformType) {
          case EGUIUniformTypeFloat:
            (*glad_glUniform1f)(GVar20,pGVar25->Data[0]);
            break;
          case EGUIUniformTypeVec2:
            (*glad_glUniform2f)(GVar20,pGVar25->Data[0],pGVar25->Data[1]);
            break;
          case EGUIUniformTypeVec3:
            (*glad_glUniform3f)(GVar20,pGVar25->Data[0],pGVar25->Data[1],pGVar25->Data[2]);
            break;
          case EGUIUniformTypeVec4:
            (*glad_glUniform4f)(GVar20,pGVar25->Data[0],pGVar25->Data[1],pGVar25->Data[2],
                                pGVar25->Data[3]);
          }
        }
        pTVar7 = (pRVar27->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pTVar26 = (pRVar27->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
                       _M_impl.super__Vector_impl_data._M_start; pTVar26 != pTVar7;
            pTVar26 = pTVar26 + 1) {
          iVar19 = (int)uVar23;
          (*glad_glActiveTexture)(iVar19 + 0x84c0);
          (*glad_glBindTexture)(0xde1,pTVar26->Id);
          p_Var15 = glad_glUniform1i;
          GVar20 = (*glad_glGetUniformLocation)
                             ((pRVar27->Program).Handle,(pTVar26->Binding)._M_dataplus._M_p);
          (*p_Var15)(GVar20,iVar19);
          p_Var16 = glad_glUniform2f;
          p_Var13 = glad_glGetUniformLocation;
          GVar21 = (pRVar27->Program).Handle;
          std::operator+(&local_d8,&pTVar26->Binding,"_resolution");
          GVar20 = (*p_Var13)(GVar21,(GLchar *)
                                     CONCAT44(local_d8._M_dataplus._M_p._4_4_,
                                              (GLuint)local_d8._M_dataplus._M_p));
          (*p_Var16)(GVar20,(float)pTVar26->Width,(float)pTVar26->Height);
          std::__cxx11::string::~string((string *)&local_d8);
          uVar23 = (ulong)(iVar19 + 1);
        }
        (*glad_glBindVertexArray)(live_glsl->VaoId);
        pRVar28 = (live_glsl->RenderPasses).
                  super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pRVar24 = (live_glsl->RenderPasses).
                       super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                       super__Vector_impl_data._M_start; pRVar24 != pRVar28; pRVar24 = pRVar24 + 1)
        {
          if (pRVar24->IsMain == true) {
            GVar21 = (*glad_glGetAttribLocation)((pRVar24->Program).Handle,"position");
            (*glad_glVertexAttribPointer)(GVar21,2,0x1406,'\0',8,(void *)0x0);
            (*glad_glEnableVertexAttribArray)(GVar21);
          }
        }
        (*glad_glDrawArrays)(4,0,6);
      }
      live_glsl->IsContinuousRendering = false;
      pRVar24 = (live_glsl->RenderPasses).
                super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (pRVar27 = (live_glsl->RenderPasses).
                     super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                     super__Vector_impl_data._M_start; pRVar27 != pRVar24; pRVar27 = pRVar27 + 1) {
        GVar20 = (*glad_glGetUniformLocation)((pRVar27->Program).Handle,"time");
        live_glsl->IsContinuousRendering = (bool)(live_glsl->IsContinuousRendering | GVar20 != -1);
      }
      if ((live_glsl->Args).Output._M_string_length == 0) goto LAB_00112246;
      iVar19 = (int)(long)((float)live_glsl->WindowWidth * live_glsl->PixelDensity);
      y_00 = (GLsizei)(long)((float)live_glsl->WindowHeight * live_glsl->PixelDensity);
      data = operator_new__((ulong)(uint)(iVar19 * 3 * y_00));
      (*glad_glReadPixels)(0,0,iVar19,y_00,0x1907,0x1401,data);
      iVar19 = stbi_write_png((live_glsl->Args).Output._M_dataplus._M_p,iVar19,y_00,3,data,
                              iVar19 * 3);
      operator_delete__(data);
      bVar11 = false;
      local_fc = 0;
      if (iVar19 == 0) {
        bVar11 = false;
        fprintf(_stderr,"Failed to write image to file: %s\n",
                (live_glsl->Args).Output._M_dataplus._M_p);
        local_fc = 1;
      }
    }
    else {
      (*glad_glBindFramebuffer)(0x8d40,0);
      (*glad_glClear)(0x4000);
LAB_00112246:
      GUIRender(live_glsl->GUI);
      glfwSwapBuffers(live_glsl->GLFWWindowHandle);
      if (live_glsl->IsContinuousRendering == true) {
        bVar11 = true;
        glfwPollEvents();
      }
      else {
        bVar11 = true;
        glfwWaitEvents();
      }
    }
    std::_Vector_base<GUITexture,_std::allocator<GUITexture>_>::~_Vector_base
              (&textures.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>);
    if (!bVar11) {
      return local_fc;
    }
  } while( true );
}

Assistant:

int LiveGLSLRender(LiveGLSL* live_glsl) {
    double previous_time = glfwGetTime();
    uint32_t frame_count = 0;

    while (!glfwWindowShouldClose(live_glsl->GLFWWindowHandle)) {
        ReloadShaderIfChanged(live_glsl, live_glsl->ShaderPath);

        double x, y;
        glfwGetCursorPos(live_glsl->GLFWWindowHandle, &x, &y);
        x *= live_glsl->PixelDensity;
        y *= live_glsl->PixelDensity;

        int mouse_left_state = glfwGetMouseButton(live_glsl->GLFWWindowHandle, GLFW_MOUSE_BUTTON_LEFT);

        if (live_glsl->ShaderCompiled) {
            for (GUIComponent& gui_component : live_glsl->GUIComponents) {
                gui_component.IsInUse = false;
                for (const auto& render_pass : live_glsl->RenderPasses) {
                    GLuint uniform_location = glGetUniformLocation(render_pass.Program.Handle, gui_component.UniformName.c_str());
                    gui_component.IsInUse |= uniform_location != -1;
                }
            }
        }

        std::vector<GUITexture> textures;
        for (const auto& render_pass : live_glsl->RenderPasses) {
            if (render_pass.TextureId) {
                GUITexture guiTexture;
                guiTexture.Width = render_pass.Width;
                guiTexture.Height = render_pass.Height;
                guiTexture.Id = render_pass.TextureId;
                textures.push_back(guiTexture);
            }
            for (const auto& texture : render_pass.Textures) {
                GUITexture guiTexture;
                guiTexture.Width = texture.Width;
                guiTexture.Height = texture.Height;
                guiTexture.Id = texture.Id;
                textures.push_back(guiTexture);
            }
        }

        GUINewFrame(live_glsl->GUI, live_glsl->GUIComponents, textures);

        if (live_glsl->ShaderCompiled) {
            for (const auto& render_pass : live_glsl->RenderPasses) {
                uint32_t width = render_pass.IsMain ? live_glsl->WindowWidth : render_pass.Width;
                uint32_t height = render_pass.IsMain ? live_glsl->WindowHeight : render_pass.Height;

                width *= live_glsl->PixelDensity;
                height *= live_glsl->PixelDensity;

                glBindFramebuffer(GL_FRAMEBUFFER, render_pass.FBO);
                glClear(GL_COLOR_BUFFER_BIT);

                assert(render_pass.Program.Handle != 0);
                glUseProgram(render_pass.Program.Handle);

                glBindBuffer(GL_ARRAY_BUFFER, live_glsl->VertexBufferId);
                glViewport(0, 0, width, height);

                glUniform2f(glGetUniformLocation(render_pass.Program.Handle, "resolution"), width, height);
                glUniform1f(glGetUniformLocation(render_pass.Program.Handle, "time"), glfwGetTime());
                glUniform1f(glGetUniformLocation(render_pass.Program.Handle, "pixel_ratio"), live_glsl->PixelDensity);
                // Mouse position, x relative to left, y relative to top
                glUniform3f(glGetUniformLocation(render_pass.Program.Handle, "mouse"), x, y, mouse_left_state == GLFW_PRESS ? 1.0f : 0.0f);

                int texture_unit = 0;

                if (!render_pass.Input.empty()) {
                    for (const auto& other : live_glsl->RenderPasses) {
                        if (other.Output == render_pass.Input) {
                            glActiveTexture(GL_TEXTURE0 + texture_unit);
                            glBindTexture(GL_TEXTURE_2D, other.TextureId);
                            glUniform1i(glGetUniformLocation(render_pass.Program.Handle, render_pass.Input.c_str()), texture_unit);
                            glUniform2f(glGetUniformLocation(render_pass.Program.Handle, (render_pass.Input + "_resolution").c_str()), other.Width, other.Height);
                            ++texture_unit;
                        }
                    }
                }

                for (const GUIComponent& gui_component : live_glsl->GUIComponents) {
                    GLuint uniform_location = glGetUniformLocation(render_pass.Program.Handle, gui_component.UniformName.c_str());
                    switch (gui_component.UniformType) {
                        case EGUIUniformTypeFloat:
                            glUniform1f(uniform_location, gui_component.Data[0]);
                            break;
                        case EGUIUniformTypeVec2:
                            glUniform2f(uniform_location, gui_component.Data[0], gui_component.Data[1]);
                            break;
                        case EGUIUniformTypeVec3:
                            glUniform3f(uniform_location, gui_component.Data[0], gui_component.Data[1], gui_component.Data[2]);
                            break;
                        case EGUIUniformTypeVec4:
                            glUniform4f(uniform_location, gui_component.Data[0], gui_component.Data[1], gui_component.Data[2], gui_component.Data[3]);
                            break;
                    }
                }

                for (const Texture& texture : render_pass.Textures) {
                    glActiveTexture(GL_TEXTURE0 + texture_unit);
                    glBindTexture(GL_TEXTURE_2D, texture.Id);
                    glUniform1i(glGetUniformLocation(render_pass.Program.Handle, texture.Binding.c_str()), texture_unit);
                    glUniform2f(glGetUniformLocation(render_pass.Program.Handle, (texture.Binding + "_resolution").c_str()), texture.Width, texture.Height);
                    ++texture_unit;
                }

                glBindVertexArray(live_glsl->VaoId);

                for (auto& render_pass : live_glsl->RenderPasses) {
                    if (render_pass.IsMain) {
                        GLint position_attrib = glGetAttribLocation(render_pass.Program.Handle, "position");
                        glVertexAttribPointer(position_attrib, 2, GL_FLOAT, GL_FALSE, 2 * sizeof(float), 0);
                        glEnableVertexAttribArray(position_attrib);
                    }
                }

                glDrawArrays(GL_TRIANGLES, 0, 6);
            }

            live_glsl->IsContinuousRendering = false;
            for (const auto& render_pass : live_glsl->RenderPasses) {
                live_glsl->IsContinuousRendering |= glGetUniformLocation(render_pass.Program.Handle, "time") != -1;
            }

            if (!live_glsl->Args.Output.empty()) {
                uint32_t width = live_glsl->WindowWidth * live_glsl->PixelDensity;
                uint32_t height = live_glsl->WindowHeight * live_glsl->PixelDensity;
                unsigned char* pixels = new unsigned char[3 * width * height];
                glReadPixels(0, 0, width, height, GL_RGB, GL_UNSIGNED_BYTE, pixels);

                int res = stbi_write_png(live_glsl->Args.Output.c_str(), width, height, 3, pixels, 3 * width);
                delete[] pixels;
                if (res == 0) {
                    fprintf(stderr, "Failed to write image to file: %s\n", live_glsl->Args.Output.c_str());
                    return EXIT_FAILURE;
                }
                return EXIT_SUCCESS;
            }
        } else {
            glBindFramebuffer(GL_FRAMEBUFFER, 0);
            glClear(GL_COLOR_BUFFER_BIT);
        }
        
        GUIRender(live_glsl->GUI);

        glfwSwapBuffers(live_glsl->GLFWWindowHandle);

        if (live_glsl->IsContinuousRendering) {
            glfwPollEvents();
        } else {
            glfwWaitEvents();
        }
    }

    return EXIT_SUCCESS;
}